

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

Id dxil_spv::build_load_buffer_offset
             (Impl *impl,ResourceReference *reference,ResourceMeta *meta,Id offset_ssbo_id,
             Id bindless_offset_id,bool non_uniform)

{
  Id IVar1;
  Id IVar2;
  uint uVar3;
  uint uVar4;
  Builder *this;
  Operation *pOVar5;
  Operation *this_00;
  bool bVar6;
  uint local_b0;
  Id local_90;
  Id const_vec;
  Id const_2 [2];
  uint shamt;
  uint ssbo_element_size;
  Operation *shift_op;
  Id offset_id;
  Operation *load_op;
  Operation *chain_op;
  Id vec_type;
  Operation *bias_op;
  Operation *scale_op;
  uint layout_offset;
  bool untyped_buffer;
  Operation *scalar_op;
  Builder *builder;
  Id local_28;
  bool non_uniform_local;
  Id bindless_offset_id_local;
  Id offset_ssbo_id_local;
  ResourceMeta *meta_local;
  ResourceReference *reference_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  local_28 = bindless_offset_id;
  if (!non_uniform) {
    IVar1 = spv::Builder::makeUintType(this,0x20);
    pOVar5 = Converter::Impl::allocate(impl,OpGroupNonUniformBroadcastFirst,IVar1);
    IVar1 = spv::Builder::makeUintConstant(this,3,false);
    Operation::add_id(pOVar5,IVar1);
    Operation::add_id(pOVar5,bindless_offset_id);
    Converter::Impl::add(impl,pOVar5,false);
    local_28 = pOVar5->id;
    spv::Builder::addCapability(this,CapabilityGroupNonUniformBallot);
  }
  bVar6 = false;
  if (meta->storage != StorageClassUniformConstant) {
    bVar6 = meta->kind != TypedBuffer;
  }
  if (bVar6) {
    local_b0 = (impl->options).offset_buffer_layout.untyped_offset;
  }
  else {
    local_b0 = (impl->options).offset_buffer_layout.typed_offset;
  }
  if ((impl->options).offset_buffer_layout.stride != 1) {
    IVar1 = spv::Builder::makeUintType(this,0x20);
    pOVar5 = Converter::Impl::allocate(impl,OpIMul,IVar1);
    Operation::add_id(pOVar5,local_28);
    IVar1 = spv::Builder::makeUintConstant(this,(impl->options).offset_buffer_layout.stride,false);
    Operation::add_id(pOVar5,IVar1);
    Converter::Impl::add(impl,pOVar5,false);
    local_28 = pOVar5->id;
  }
  if (local_b0 != 0) {
    IVar1 = spv::Builder::makeUintType(this,0x20);
    pOVar5 = Converter::Impl::allocate(impl,OpIAdd,IVar1);
    Operation::add_id(pOVar5,local_28);
    IVar1 = spv::Builder::makeUintConstant(this,local_b0,false);
    Operation::add_id(pOVar5,IVar1);
    Converter::Impl::add(impl,pOVar5,false);
    local_28 = pOVar5->id;
  }
  IVar1 = spv::Builder::makeUintType(this,0x20);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
  IVar2 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar1);
  pOVar5 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
  Operation::add_id(pOVar5,offset_ssbo_id);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(pOVar5,IVar2);
  Operation::add_id(pOVar5,local_28);
  Converter::Impl::add(impl,pOVar5,false);
  this_00 = Converter::Impl::allocate(impl,OpLoad,IVar1);
  Operation::add_id(this_00,pOVar5->id);
  Converter::Impl::add(impl,this_00,false);
  shift_op._4_4_ = this_00->id;
  if ((bVar6) && ((reference->aliased & 1U) == 0)) {
    pOVar5 = Converter::Impl::allocate(impl,OpShiftRightLogical,IVar1);
    Operation::add_id(pOVar5,shift_op._4_4_);
    uVar3 = raw_vecsize_to_vecsize(meta->raw_component_vecsize);
    uVar4 = raw_component_type_to_bits(meta->component_type);
    const_2[0] = 0;
    for (const_2[1] = uVar3 * uVar4 >> 3; 1 < const_2[1]; const_2[1] = const_2[1] >> 1) {
      const_2[0] = const_2[0] + 1;
    }
    local_90 = spv::Builder::makeUintConstant(this,const_2[0],false);
    const_vec = local_90;
    IVar1 = spv::Builder::makeUintType(this,0x20);
    IVar1 = Converter::Impl::build_constant_vector(impl,IVar1,&local_90,2);
    Operation::add_id(pOVar5,IVar1);
    Converter::Impl::add(impl,pOVar5,false);
    shift_op._4_4_ = pOVar5->id;
  }
  return shift_op._4_4_;
}

Assistant:

static spv::Id build_load_buffer_offset(Converter::Impl &impl, Converter::Impl::ResourceReference &reference,
                                        Converter::Impl::ResourceMeta &meta,
                                        spv::Id offset_ssbo_id, spv::Id bindless_offset_id, bool non_uniform)
{
	auto &builder = impl.builder();

	if (!non_uniform)
	{
		// Allow scalar load of the offset if possible.
		Operation *scalar_op = impl.allocate(spv::OpGroupNonUniformBroadcastFirst, builder.makeUintType(32));
		scalar_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		scalar_op->add_id(bindless_offset_id);
		impl.add(scalar_op);
		bindless_offset_id = scalar_op->id;
		builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	}

	bool untyped_buffer = meta.storage != spv::StorageClassUniformConstant &&
	                      meta.kind != DXIL::ResourceKind::TypedBuffer;
	unsigned layout_offset = untyped_buffer ? impl.options.offset_buffer_layout.untyped_offset :
	                         impl.options.offset_buffer_layout.typed_offset;

	if (impl.options.offset_buffer_layout.stride != 1)
	{
		Operation *scale_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		scale_op->add_id(bindless_offset_id);
		scale_op->add_id(builder.makeUintConstant(impl.options.offset_buffer_layout.stride));
		impl.add(scale_op);
		bindless_offset_id = scale_op->id;
	}

	if (layout_offset)
	{
		Operation *bias_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		bias_op->add_id(bindless_offset_id);
		bias_op->add_id(builder.makeUintConstant(layout_offset));
		impl.add(bias_op);
		bindless_offset_id = bias_op->id;
	}

	spv::Id vec_type = builder.makeVectorType(builder.makeUintType(32), 2);

	Operation *chain_op = impl.allocate(spv::OpAccessChain,
	                                    builder.makePointer(spv::StorageClassStorageBuffer,
	                                                        vec_type));
	chain_op->add_id(offset_ssbo_id);
	chain_op->add_id(builder.makeUintConstant(0));
	chain_op->add_id(bindless_offset_id);
	impl.add(chain_op);

	Operation *load_op = impl.allocate(spv::OpLoad, vec_type);
	load_op->add_id(chain_op->id);
	impl.add(load_op);

	spv::Id offset_id = load_op->id;

	// Shift the offset buffer once if we can get away with it.
	if (untyped_buffer && !reference.aliased)
	{
		Operation *shift_op = impl.allocate(spv::OpShiftRightLogical, vec_type);
		shift_op->add_id(offset_id);

		unsigned ssbo_element_size =
			raw_vecsize_to_vecsize(meta.raw_component_vecsize) *
			raw_component_type_to_bits(meta.component_type) / 8;

		unsigned shamt = 0;
		while (ssbo_element_size > 1)
		{
			shamt++;
			ssbo_element_size >>= 1;
		}

		spv::Id const_2[2];
		const_2[0] = const_2[1] = builder.makeUintConstant(shamt);
		spv::Id const_vec = impl.build_constant_vector(builder.makeUintType(32), const_2, 2);

		shift_op->add_id(const_vec);
		impl.add(shift_op);

		offset_id = shift_op->id;
	}

	return offset_id;
}